

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O0

void ngram_fwdflat_free_1ph(ngram_search_t *ngs)

{
  int iVar1;
  int local_18;
  int n_words;
  int w;
  int i;
  ngram_search_t *ngs_local;
  
  iVar1 = (ngs->base).n_words;
  n_words = 0;
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    if (((ngs->base).dict)->word[local_18].pronlen == 1) {
      hmm_deinit(&ngs->rhmm_1ph[n_words].hmm);
      n_words = n_words + 1;
    }
  }
  ckd_free(ngs->rhmm_1ph);
  ngs->rhmm_1ph = (root_chan_t *)0x0;
  ckd_free(ngs->single_phone_wid);
  return;
}

Assistant:

static void
ngram_fwdflat_free_1ph(ngram_search_t *ngs)
{
    int i, w;
    int n_words = ps_search_n_words(ngs);

    for (i = w = 0; w < n_words; ++w) {
        if (!dict_is_single_phone(ps_search_dict(ngs), w))
            continue;
        hmm_deinit(&ngs->rhmm_1ph[i].hmm);
        ++i;
    }
    ckd_free(ngs->rhmm_1ph);
    ngs->rhmm_1ph = NULL;
    ckd_free(ngs->single_phone_wid);
}